

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcTopologyRepresentation::~IfcTopologyRepresentation
          (IfcTopologyRepresentation *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined1 *puVar2;
  pointer pLVar3;
  pointer pcVar4;
  undefined1 *puVar5;
  
  (this->super_IfcShapeModel).super_IfcRepresentation.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentation,_4UL>._vptr_ObjectHelper =
       (_func_int **)0x80a6b0;
  *(undefined8 *)&(this->super_IfcShapeModel).field_0xa0 = 0x80a6d8;
  pLVar3 = (this->super_IfcShapeModel).super_IfcRepresentation.Items.
           super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
           .
           super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pLVar3 != (pointer)0x0) {
    operator_delete(pLVar3,(long)*(pointer *)
                                  ((long)&(this->super_IfcShapeModel).super_IfcRepresentation.Items.
                                          super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
                                          .
                                          super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
                                          ._M_impl.super__Vector_impl_data + 0x10) - (long)pLVar3);
  }
  pcVar4 = (this->super_IfcShapeModel).super_IfcRepresentation.RepresentationType.ptr._M_dataplus.
           _M_p;
  paVar1 = &(this->super_IfcShapeModel).super_IfcRepresentation.RepresentationType.ptr.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  puVar5 = *(undefined1 **)
            &(this->super_IfcShapeModel).super_IfcRepresentation.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentation,_4UL>.field_0x18;
  puVar2 = &(this->super_IfcShapeModel).super_IfcRepresentation.field_0x28;
  if (puVar5 != puVar2) {
    operator_delete(puVar5,*(long *)puVar2 + 1);
  }
  operator_delete(this,0xb8);
  return;
}

Assistant:

IfcTopologyRepresentation() : Object("IfcTopologyRepresentation") {}